

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

UBool icu_63::CollationBuilder::sameCEs
                (int64_t *ces1,int32_t ces1Length,int64_t *ces2,int32_t ces2Length)

{
  ulong uVar1;
  ulong uVar2;
  
  if (ces1Length == ces2Length) {
    if (ces1Length < 1) {
      return '\x01';
    }
    if (*ces1 == *ces2) {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if ((uint)ces1Length == uVar2) break;
        uVar1 = uVar2 + 1;
      } while (ces1[uVar2] == ces2[uVar2]);
      return (uint)ces1Length <= uVar2;
    }
  }
  return '\0';
}

Assistant:

UBool
CollationBuilder::sameCEs(const int64_t ces1[], int32_t ces1Length,
                          const int64_t ces2[], int32_t ces2Length) {
    if(ces1Length != ces2Length) {
        return FALSE;
    }
    U_ASSERT(ces1Length <= Collation::MAX_EXPANSION_LENGTH);
    for(int32_t i = 0; i < ces1Length; ++i) {
        if(ces1[i] != ces2[i]) { return FALSE; }
    }
    return TRUE;
}